

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
          (OptionBase<CLI::OptionDefaults> *this,Option *other)

{
  string local_38;
  Option *local_18;
  Option *other_local;
  OptionBase<CLI::OptionDefaults> *this_local;
  
  local_18 = other;
  other_local = (Option *)this;
  ::std::__cxx11::string::string((string *)&local_38,(string *)this);
  OptionBase<CLI::Option>::group(&other->super_OptionBase<CLI::Option>,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  OptionBase<CLI::Option>::required
            (&local_18->super_OptionBase<CLI::Option>,(bool)(this->required_ & 1));
  Option::ignore_case<CLI::App>(local_18,(bool)(this->ignore_case_ & 1));
  Option::ignore_underscore<CLI::App>(local_18,(bool)(this->ignore_underscore_ & 1));
  OptionBase<CLI::Option>::configurable
            (&local_18->super_OptionBase<CLI::Option>,(bool)(this->configurable_ & 1));
  Option::multi_option_policy(local_18,this->multi_option_policy_);
  return;
}

Assistant:

void copy_to(T *other) const {
        other->group(group_);
        other->required(required_);
        other->ignore_case(ignore_case_);
        other->ignore_underscore(ignore_underscore_);
        other->configurable(configurable_);
        other->multi_option_policy(multi_option_policy_);
    }